

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

void __thiscall I2sAnalyzer::AnalyzeFrame(I2sAnalyzer *this)

{
  PcmFrameType PVar1;
  uint num_bits_00;
  uint uVar2;
  size_type sVar3;
  element_type *peVar4;
  reference pvVar5;
  element_type *peVar6;
  uint local_9c;
  int local_98;
  U32 i;
  U32 starting_offset;
  U32 num_unused_bits;
  FrameV2 frame_v2_1;
  Frame frame_1;
  U32 num_audio_bits;
  U32 bits_per_frame;
  FrameV2 frame_v2;
  value_type local_40;
  Frame frame;
  uint local_18;
  U32 num_frames;
  U32 num_bits;
  I2sAnalyzer *this_local;
  
  sVar3 = std::vector<BitState,_std::allocator<BitState>_>::size(&this->mDataBits);
  local_18 = 0;
  peVar4 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  PVar1 = peVar4->mFrameType;
  if (PVar1 == FRAME_TRANSITION_TWICE_EVERY_WORD) {
    local_18 = 1;
  }
  else if (PVar1 == FRAME_TRANSITION_ONCE_EVERY_WORD) {
    local_18 = 2;
  }
  else if (PVar1 == FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS) {
    local_18 = 4;
  }
  else {
    AnalyzerHelpers::Assert("unexpected");
  }
  if ((uint)sVar3 % local_18 == 0) {
    uVar2 = (uint)sVar3 / local_18;
    peVar4 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
    num_bits_00 = peVar4->mBitsPerWord;
    if (uVar2 < num_bits_00) {
      Frame::Frame((Frame *)&frame_v2_1);
      pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::front
                         (&this->mDataValidEdges);
      _frame_v2_1 = *pvVar5;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::back
                (&this->mDataValidEdges);
      peVar6 = std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::AddFrame((Frame *)peVar6);
      FrameV2::FrameV2((FrameV2 *)&starting_offset);
      FrameV2::AddString((char *)&starting_offset,"error");
      peVar6 = std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::AddFrameV2((FrameV2 *)peVar6,(char *)&starting_offset,0x11200b,_frame_v2_1);
      FrameV2::~FrameV2((FrameV2 *)&starting_offset);
      Frame::~Frame((Frame *)&frame_v2_1);
    }
    else {
      local_98 = uVar2 - num_bits_00;
      peVar4 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
      if (peVar4->mWordAlignment == LEFT_ALIGNED) {
        local_98 = 0;
      }
      for (local_9c = 0; local_9c < local_18; local_9c = local_9c + 1) {
        AnalyzeSubFrame(this,local_9c * uVar2 + local_98,num_bits_00,local_9c);
      }
    }
  }
  else {
    Frame::Frame((Frame *)&local_40);
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::front
                       (&this->mDataValidEdges);
    local_40 = *pvVar5;
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::back
                       (&this->mDataValidEdges);
    _frame = *pvVar5;
    peVar6 = std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
    AnalyzerResults::AddFrame((Frame *)peVar6);
    FrameV2::FrameV2((FrameV2 *)&num_audio_bits);
    FrameV2::AddString((char *)&num_audio_bits,"error");
    peVar6 = std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
    AnalyzerResults::AddFrameV2((FrameV2 *)peVar6,(char *)&num_audio_bits,0x11200b,local_40);
    FrameV2::~FrameV2((FrameV2 *)&num_audio_bits);
    Frame::~Frame((Frame *)&local_40);
  }
  return;
}

Assistant:

void I2sAnalyzer::AnalyzeFrame()
{
    U32 num_bits = mDataBits.size();

    U32 num_frames = 0;
    switch( mSettings->mFrameType )
    {
    case FRAME_TRANSITION_TWICE_EVERY_WORD:
        num_frames = 1;
        break;
    case FRAME_TRANSITION_ONCE_EVERY_WORD:
        num_frames = 2;
        break;
    case FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS:
        num_frames = 4;
        break;
    default:
        AnalyzerHelpers::Assert( "unexpected" );
        break;
    }

    if( ( num_bits % num_frames ) != 0 )
    {
        Frame frame;
        frame.mType = U8( ErrorDoesntDivideEvenly );
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
        frame.mStartingSampleInclusive = mDataValidEdges.front();
        frame.mEndingSampleInclusive = mDataValidEdges.back();
        mResults->AddFrame( frame );
        FrameV2 frame_v2;
        frame_v2.AddString( "error", "invalid number of bits" );
        mResults->AddFrameV2( frame_v2, "error", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
        return;
    }

    U32 bits_per_frame = num_bits / num_frames;
    U32 num_audio_bits = mSettings->mBitsPerWord;

    if( bits_per_frame < num_audio_bits )
    {
        // enum I2sResultType { Channel1, Cahannel2, ErrorTooFewBits, ErrorDoesntDivideEvenly };
        Frame frame;
        frame.mType = U8( ErrorTooFewBits );
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
        frame.mStartingSampleInclusive = mDataValidEdges.front();
        frame.mEndingSampleInclusive = mDataValidEdges.back();
        mResults->AddFrame( frame );
        FrameV2 frame_v2;
        frame_v2.AddString( "error", "not enough bits" );
        mResults->AddFrameV2( frame_v2, "error", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
        return;
    }

    U32 num_unused_bits = bits_per_frame - num_audio_bits;
    U32 starting_offset;

    if( mSettings->mWordAlignment == LEFT_ALIGNED )
        starting_offset = 0;
    else
        starting_offset = num_unused_bits;

    for( U32 i = 0; i < num_frames; i++ )
    {
        AnalyzeSubFrame( i * bits_per_frame + starting_offset, num_audio_bits, i );
    }
}